

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class2_test_bundle_adjustment.cc
# Opt level: O2

bool calc_cam_poses(Correspondences2D2D *matches,CameraPose *pose1,CameraPose *pose2,float f1,
                   float f2)

{
  double dVar1;
  long lVar2;
  double dVar3;
  bool bVar4;
  Matrix<double,_3,_3> *this;
  long lVar5;
  CameraPose *pose2_00;
  size_t i;
  ulong uVar6;
  undefined1 local_128 [8];
  FundamentalMatrix F;
  EssentialMatrix E;
  vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> poses;
  
  sfm::fundamental_least_squares(matches,(FundamentalMatrix *)local_128);
  sfm::enforce_essential_constraints((FundamentalMatrix *)local_128);
  sfm::CameraPose::set_k_matrix(pose1,(double)f1,0.0,0.0);
  sfm::CameraPose::init_canonical_form(pose1);
  sfm::CameraPose::set_k_matrix(pose2,(double)f2,0.0,0.0);
  this = math::matrix_inplace_transpose<double,3>(&pose2->K);
  math::Matrix<double,_3,_3>::mult<3>
            ((Matrix<double,_3,_3> *)(E.m + 8),this,(FundamentalMatrix *)local_128);
  math::Matrix<double,_3,_3>::mult<3>
            ((Matrix<double,_3,_3> *)(F.m + 8),(Matrix<double,_3,_3> *)(E.m + 8),&pose1->K);
  E.m[8] = 0.0;
  sfm::pose_from_essential
            ((EssentialMatrix *)(F.m + 8),
             (vector<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> *)(E.m + 8));
  lVar5 = 0;
  uVar6 = 0;
  do {
    lVar2 = -(long)E.m[8];
    if ((ulong)(lVar2 / 0xa8) <= uVar6) {
LAB_001082d4:
      std::_Vector_base<sfm::CameraPose,_std::allocator<sfm::CameraPose>_>::~_Vector_base
                ((_Vector_base<sfm::CameraPose,_std::allocator<sfm::CameraPose>_> *)(E.m + 8));
      return uVar6 < (ulong)(lVar2 / 0xa8);
    }
    pose2_00 = (CameraPose *)((long)E.m[8] + lVar5);
    memmove(pose2_00,pose2,0x48);
    bVar4 = sfm::is_consistent_pose
                      ((matches->
                       super__Vector_base<sfm::Correspondence2D2D,_std::allocator<sfm::Correspondence2D2D>_>
                       )._M_impl.super__Vector_impl_data._M_start,pose1,pose2_00);
    dVar1 = E.m[8];
    if (bVar4) {
      memmove(pose2,(void *)(lVar5 + (long)E.m[8]),0x48);
      lVar5 = (long)dVar1 + lVar5;
      memmove(&pose2->R,(void *)(lVar5 + 0x48),0x48);
      dVar1 = *(double *)(lVar5 + 0xa0);
      dVar3 = *(double *)(lVar5 + 0x98);
      (pose2->t).v[0] = *(double *)(lVar5 + 0x90);
      (pose2->t).v[1] = dVar3;
      (pose2->t).v[2] = dVar1;
      goto LAB_001082d4;
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0xa8;
  } while( true );
}

Assistant:

bool calc_cam_poses(sfm::Correspondences2D2D const &matches
                  , sfm::CameraPose* pose1
                  , sfm::CameraPose* pose2
                  , float f1
                  , float f2)
{
    // calculate fundamental matrix from  pair correspondences
    sfm::FundamentalMatrix F;
    sfm::fundamental_least_squares(matches, &F);
    sfm::enforce_essential_constraints(&F);

    // 设置相机1的内参矩阵
    pose1->set_k_matrix(f1, 0.0, 0.0);
    // 相机1为参考矩阵，将其姿态设置成单位矩阵
    pose1->init_canonical_form();
    pose2->set_k_matrix(f2, 0.0, 0.0);

    // todo 从本征矩阵中计算本质矩阵
    sfm::EssentialMatrix E = pose2->K.transpose()*F*pose1->K;

    // 从本质矩阵中计算相机姿态,一共有四种情况
    std::vector<sfm::CameraPose> poses;
    sfm::pose_from_essential(E, &poses);

    // 利用匹配点对从4中相机姿态中找到最合适的(利用姿态对匹配点进行三角化得到三维点，计算三维点的相机坐标，
    // 在两个相机的中的z坐标必须为正
    bool found_pose=false;
    for(std::size_t i=0; i< poses.size(); ++i){
        poses[i].K = pose2->K;
        if(sfm::is_consistent_pose(matches[0],*pose1, poses[i]))
        {
            *pose2 = poses[i];
            found_pose = true;
            break;
        }
    }
    return found_pose;
}